

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O2

void figure_out_visual(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  beenhere = 1;
  uVar1 = fl_visual->red_mask;
  if (((uVar1 == 0) || (uVar2 = fl_visual->green_mask, uVar2 == 0)) ||
     (uVar3 = fl_visual->blue_mask, uVar3 == 0)) {
    fl_redmask = '\0';
    return;
  }
  fl_redshift = -8;
  for (iVar5 = 1; (fl_redshift != 0x18 && ((uVar1 & (long)iVar5) == 0)); iVar5 = iVar5 * 2) {
    fl_redshift = fl_redshift + 1;
  }
  iVar4 = 0;
  while( true ) {
    if ((iVar5 == 0) || ((uVar1 & (long)iVar5) == 0)) break;
    iVar5 = iVar5 * 2;
    fl_redshift = fl_redshift + 1;
    iVar4 = iVar4 + 1;
  }
  fl_redmask = ~(byte)(0xff >> ((byte)iVar4 & 0x1f));
  if (7 < iVar4) {
    fl_redmask = 0xff;
  }
  fl_greenshift = -8;
  for (iVar5 = 1; (fl_greenshift != 0x18 && ((uVar2 & (long)iVar5) == 0)); iVar5 = iVar5 * 2) {
    fl_greenshift = fl_greenshift + 1;
  }
  iVar4 = 0;
  while( true ) {
    if ((iVar5 == 0) || ((uVar2 & (long)iVar5) == 0)) break;
    iVar5 = iVar5 * 2;
    fl_greenshift = fl_greenshift + 1;
    iVar4 = iVar4 + 1;
  }
  fl_greenmask = ~(byte)(0xff >> ((byte)iVar4 & 0x1f));
  if (7 < iVar4) {
    fl_greenmask = 0xff;
  }
  fl_blueshift = -8;
  for (iVar5 = 1; (fl_blueshift != 0x18 && ((uVar3 & (long)iVar5) == 0)); iVar5 = iVar5 * 2) {
    fl_blueshift = fl_blueshift + 1;
  }
  iVar4 = 0;
  while( true ) {
    if ((iVar5 == 0) || ((uVar3 & (long)iVar5) == 0)) break;
    iVar5 = iVar5 * 2;
    fl_blueshift = fl_blueshift + 1;
    iVar4 = iVar4 + 1;
  }
  fl_bluemask = ~(byte)(0xff >> ((byte)iVar4 & 0x1f));
  if (7 < iVar4) {
    fl_bluemask = 0xff;
  }
  iVar5 = fl_redshift;
  if (fl_greenshift < fl_redshift) {
    iVar5 = fl_greenshift;
  }
  if (fl_blueshift < iVar5) {
    iVar5 = fl_blueshift;
  }
  if (-1 < iVar5) {
    fl_extrashift = 0;
    return;
  }
  fl_extrashift = -iVar5;
  iVar5 = fl_greenshift;
  if (fl_redshift < fl_greenshift) {
    iVar5 = fl_redshift;
  }
  if (fl_blueshift <= iVar5) {
    iVar5 = fl_blueshift;
  }
  fl_redshift = fl_redshift - iVar5;
  fl_greenshift = fl_greenshift - iVar5;
  fl_blueshift = fl_blueshift - iVar5;
  return;
}

Assistant:

static void figure_out_visual() {
  beenhere = 1;
  if (!fl_visual->red_mask || !fl_visual->green_mask || !fl_visual->blue_mask){
#  if USE_COLORMAP
    fl_redmask = 0;
    return;
#  else
    Fl::fatal("Requires true color visual");
#  endif
  }

  // get the bit masks into a more useful form:
  int i,j,m;

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->red_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->red_mask & m)) break;
  fl_redshift = j-8;
  fl_redmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->green_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->green_mask & m)) break;
  fl_greenshift = j-8;
  fl_greenmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->blue_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->blue_mask & m)) break;
  fl_blueshift = j-8;
  fl_bluemask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  i = fl_redshift;
  if (fl_greenshift < i) i = fl_greenshift;
  if (fl_blueshift < i) i = fl_blueshift;
  if (i < 0) {
    fl_extrashift = -i;
    fl_redshift -= i; fl_greenshift -= i; fl_blueshift -= i;
  } else
    fl_extrashift = 0;

}